

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

Maybe<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Entry_&>
__thiscall
kj::
Table<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Entry,kj::HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Callbacks>>
::find<0ul,unsigned_int&>
          (Table<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Entry,kj::HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Callbacks>>
           *this,uint *params)

{
  HashIndex<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Callbacks>
  *pHVar1;
  NullableValue<unsigned_long> *other;
  unsigned_long *puVar2;
  Entry *t;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 in_RDX;
  ArrayPtr<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Entry>
  AVar3;
  unsigned_long *pos;
  Entry *local_50;
  uint *local_48;
  Maybe<unsigned_long> local_40;
  undefined1 local_30 [8];
  NullableValue<unsigned_long> _pos583;
  uint *params_local;
  Table<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Entry,_kj::HashIndex<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Callbacks>_>
  *this_local;
  
  _pos583.field_1 = in_RDX;
  pHVar1 = get<0ul,kj::HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Callbacks>&>
                     ((HashIndex<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Callbacks>
                       *)(params + 8));
  AVar3 = Vector<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Entry>
          ::asPtr((Vector<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Entry>
                   *)params);
  fwd<unsigned_int&>((uint *)_pos583.field_1);
  local_50 = AVar3.ptr;
  local_48 = (uint *)AVar3.size_;
  AVar3.size_ = (size_t)local_50;
  AVar3.ptr = (Entry *)pHVar1;
  HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Callbacks>
  ::
  find<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Entry,unsigned_int&>
            ((HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Callbacks>
              *)&local_40,AVar3,local_48);
  other = kj::_::readMaybe<unsigned_long>(&local_40);
  kj::_::NullableValue<unsigned_long>::NullableValue((NullableValue<unsigned_long> *)local_30,other)
  ;
  Maybe<unsigned_long>::~Maybe(&local_40);
  puVar2 = kj::_::NullableValue::operator_cast_to_unsigned_long_((NullableValue *)local_30);
  if (puVar2 == (unsigned_long *)0x0) {
    Maybe<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Entry_&>
    ::Maybe((Maybe<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Entry_&>
             *)this);
  }
  else {
    puVar2 = kj::_::NullableValue<unsigned_long>::operator*
                       ((NullableValue<unsigned_long> *)local_30);
    t = Vector<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Entry>
        ::operator[]((Vector<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Entry>
                      *)params,*puVar2);
    Maybe<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Entry_&>
    ::Maybe((Maybe<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Entry_&>
             *)this,t);
  }
  kj::_::NullableValue<unsigned_long>::~NullableValue((NullableValue<unsigned_long> *)local_30);
  return (Maybe<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Entry_&>
          )(Entry *)this;
}

Assistant:

kj::Maybe<Row&> Table<Row, Indexes...>::find(Params&&... params) {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[pos];
  } else {
    return kj::none;
  }
}